

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O2

bool __thiscall
s2textformat::InternalMakePolygon
          (s2textformat *this,string_view str,S2Debug debug_override,bool normalize_loops,
          unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *polygon)

{
  __uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_> *this_00;
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> __p;
  bool bVar1;
  undefined7 in_register_00000081;
  string_view str_00;
  string_view str_01;
  string_view x;
  S2Debug debug_override_local;
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> loop;
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  loops;
  vector<absl::string_view,_std::allocator<absl::string_view>_> loop_strs;
  string_view local_40;
  
  x.length_ = (pointer)str.ptr_;
  this_00 = (__uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_> *)
            CONCAT71(in_register_00000081,normalize_loops);
  debug_override_local = (S2Debug)str.length_;
  absl::string_view::string_view(&local_40,"empty");
  x.ptr_ = (char *)this;
  bVar1 = absl::operator==(x,local_40);
  if (bVar1) {
    absl::string_view::string_view((string_view *)&loop_strs,"");
    this = (s2textformat *)
           loop_strs.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
           _M_impl.super__Vector_impl_data._M_start;
    x.length_ = loop_strs.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  }
  str_01.length_ = 0x3b;
  str_01.ptr_ = (char *)x.length_;
  SplitString(&loop_strs,this,str_01,normalize_loops);
  loops.
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  loops.
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  loops.
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  x.length_ = loop_strs.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
              _M_impl.super__Vector_impl_data._M_start;
  do {
    if (x.length_ ==
        loop_strs.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      absl::
      make_unique<S2Polygon,std::vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>,S2Debug&>
                ((absl *)&loop,&loops,&debug_override_local);
      __p = loop;
      loop._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
      super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
      super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
           (__uniq_ptr_data<S2Loop,_std::default_delete<S2Loop>,_true,_true>)
           (__uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>)0x0;
      std::__uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>::reset
                (this_00,(pointer)__p._M_t.
                                  super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
                                  super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                                  super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl);
      std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>::~unique_ptr
                ((unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *)&loop);
LAB_00262c68:
      std::
      vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ::~vector(&loops);
      std::_Vector_base<absl::string_view,_std::allocator<absl::string_view>_>::~_Vector_base
                (&loop_strs.
                  super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>);
      return x.length_ ==
             loop_strs.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    }
    loop._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
    super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
    super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
         (__uniq_ptr_data<S2Loop,_std::default_delete<S2Loop>,_true,_true>)
         (__uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>)0x0;
    str_00.length_ = (size_type)&loop;
    str_00.ptr_ = (char *)(x.length_)->length_;
    bVar1 = MakeLoop((s2textformat *)(x.length_)->ptr_,str_00,
                     (unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)
                     (ulong)((uint)str.length_ & 0xff),normalize_loops);
    if (!bVar1) {
      std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::~unique_ptr(&loop);
      goto LAB_00262c68;
    }
    if ((debug_override != ALLOW) &&
       ((*(int *)((long)loop._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
                        super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                        super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0xc) != 1 ||
        ((*(byte *)((long)loop._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t
                          .super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                          super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0x1a) & 1) == 0))))
    {
      S2Loop::Normalize((S2Loop *)
                        loop._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
                        super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                        super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl);
    }
    std::
    vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
    ::emplace_back<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>
              ((vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
                *)&loops,&loop);
    std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::~unique_ptr(&loop);
    x.length_ = x.length_ + 1;
  } while( true );
}

Assistant:

static bool InternalMakePolygon(string_view str,
                                S2Debug debug_override,
                                bool normalize_loops,
                                unique_ptr<S2Polygon>* polygon) {
  if (str == "empty") str = "";
  vector<string_view> loop_strs = SplitString(str, ';');
  vector<unique_ptr<S2Loop>> loops;
  for (const auto& loop_str : loop_strs) {
    std::unique_ptr<S2Loop> loop;
    if (!MakeLoop(loop_str, &loop, debug_override)) return false;
    // Don't normalize loops that were explicitly specified as "full".
    if (normalize_loops && !loop->is_full()) loop->Normalize();
    loops.push_back(std::move(loop));
  }
  *polygon = make_unique<S2Polygon>(std::move(loops), debug_override);
  return true;
}